

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTargetInternalPointer::~cmTargetInternalPointer(cmTargetInternalPointer *this)

{
  cmTargetInternals *this_00;
  
  cmDeleteAll<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
            (&this->Pointer->IncludeDirectoriesEntries);
  cmDeleteAll<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
            (&this->Pointer->CompileOptionsEntries);
  cmDeleteAll<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
            (&this->Pointer->CompileFeaturesEntries);
  cmDeleteAll<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
            (&this->Pointer->CompileDefinitionsEntries);
  cmDeleteAll<std::vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>>
            (&this->Pointer->SourceEntries);
  this_00 = this->Pointer;
  if (this_00 != (cmTargetInternals *)0x0) {
    cmTargetInternals::~cmTargetInternals(this_00);
  }
  operator_delete(this_00,0x2e0);
  return;
}

Assistant:

cmTargetInternalPointer::~cmTargetInternalPointer()
{
  cmDeleteAll(this->Pointer->IncludeDirectoriesEntries);
  cmDeleteAll(this->Pointer->CompileOptionsEntries);
  cmDeleteAll(this->Pointer->CompileFeaturesEntries);
  cmDeleteAll(this->Pointer->CompileDefinitionsEntries);
  cmDeleteAll(this->Pointer->SourceEntries);
  delete this->Pointer;
}